

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::initialiseForSolve(HEkk *this)

{
  HighsOptions *pHVar1;
  HighsInt solve_phase;
  HighsModelStatus HVar2;
  
  initialiseSimplexLpBasisAndFactor(this,false);
  pHVar1 = this->options_;
  (this->info_).dual_simplex_cost_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).dual_simplex_cost_perturbation_multiplier;
  (this->info_).primal_simplex_bound_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).primal_simplex_bound_perturbation_multiplier;
  initialiseSimplexLpRandomVectors(this);
  initialisePartitionedRowwiseMatrix(this);
  allocateWorkAndBaseArrays(this);
  initialiseCost(this,kPrimal,solve_phase,false);
  initialiseLpColBound(this);
  initialiseLpRowBound(this);
  (this->info_).bounds_perturbed = false;
  initialiseNonbasicValueAndMove(this);
  computePrimal(this);
  computeDual(this);
  computeSimplexPrimalInfeasible(this);
  computeSimplexDualInfeasible(this);
  computeDualObjectiveValue(this,2);
  computePrimalObjectiveValue(this);
  (this->status_).initialised_for_solve = true;
  HVar2 = kOptimal;
  if ((this->info_).num_dual_infeasibilities != 0 || (this->info_).num_primal_infeasibilities != 0)
  {
    HVar2 = kMin;
  }
  HighsHashTable<unsigned_long,_void>::clear(&this->visited_basis_);
  HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
            ((HighsHashTable<unsigned_long,void> *)&this->visited_basis_,&(this->basis_).hash);
  this->model_status_ = HVar2;
  return;
}

Assistant:

void HEkk::initialiseForSolve() {
  const HighsStatus return_status = initialiseSimplexLpBasisAndFactor();
  assert(return_status == HighsStatus::kOk);
  assert(status_.has_basis);

  updateSimplexOptions();
  initialiseSimplexLpRandomVectors();
  initialisePartitionedRowwiseMatrix();  // Timed
  allocateWorkAndBaseArrays();
  initialiseCost(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown, false);
  initialiseBound(SimplexAlgorithm::kPrimal, kSolvePhaseUnknown, false);
  initialiseNonbasicValueAndMove();
  computePrimal();                // Timed
  computeDual();                  // Timed
  computeSimplexInfeasible();     // Timed
  computeDualObjectiveValue();    // Timed
  computePrimalObjectiveValue();  // Timed
  status_.initialised_for_solve = true;

  bool primal_feasible = info_.num_primal_infeasibilities == 0;
  bool dual_feasible = info_.num_dual_infeasibilities == 0;
  visited_basis_.clear();
  visited_basis_.insert(basis_.hash);
  model_status_ = HighsModelStatus::kNotset;
  if (primal_feasible && dual_feasible)
    model_status_ = HighsModelStatus::kOptimal;
}